

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

bool xatlas::internal::param::Solver::LeastSquaresSolver
               (Matrix *A,FullVector *b,FullVector *x,float epsilon)

{
  float fVar1;
  uint h;
  uint uVar2;
  uint32_t uVar3;
  bool bVar4;
  Array<xatlas::internal::sparse::Matrix::Coefficient> *pAVar5;
  Coefficient *pCVar6;
  uint32_t x_1;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t x_2;
  uint32_t uVar9;
  uint32_t i;
  float fVar10;
  float fVar11;
  float fVar12;
  Matrix At;
  Matrix AtA;
  FullVector Atb;
  Matrix local_90;
  FullVector *local_70;
  Matrix local_68;
  ArrayBase local_48;
  
  h = A->m_width;
  local_70 = x;
  if (h != (x->m_array).m_base.size) {
    __assert_fail("A.width() == x.dimension()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x166d,
                  "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
                 );
  }
  uVar2 = (A->m_array).m_base.size;
  if (uVar2 != (b->m_array).m_base.size) {
    __assert_fail("A.height() == b.dimension()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x166e,
                  "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
                 );
  }
  if (uVar2 < h) {
    __assert_fail("A.height() >= A.width()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x166f,
                  "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
                 );
  }
  sparse::Matrix::Matrix(&local_90,uVar2,h);
  uVar2 = A->m_width;
  if (uVar2 == local_90.m_array.m_base.size) {
    if (local_90.m_width != (A->m_array).m_base.size) {
      __assert_fail("B.width() == A.height()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x128b,"void xatlas::internal::sparse::transpose(const Matrix &, Matrix &)");
    }
    for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      sparse::Matrix::clearRow(&local_90,uVar7);
    }
    uVar7 = (A->m_array).m_base.size;
    for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      pAVar5 = Array<xatlas::internal::Array<xatlas::internal::sparse::Matrix::Coefficient>_>::
               operator[](&A->m_array,uVar9);
      uVar3 = (pAVar5->m_base).size;
      for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
        pCVar6 = Array<xatlas::internal::sparse::Matrix::Coefficient>::operator[](pAVar5,uVar8);
        if (uVar2 <= pCVar6->x) {
          __assert_fail("c.x < w",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x1296,"void xatlas::internal::sparse::transpose(const Matrix &, Matrix &)"
                       );
        }
        sparse::Matrix::setCoefficient(&local_90,uVar9,pCVar6->x,pCVar6->v);
      }
    }
    FullVector::FullVector((FullVector *)&local_48,h);
    sparse::mult(&local_90,b,(FullVector *)&local_48);
    sparse::Matrix::Matrix(&local_68,h);
    if (local_90.m_width != (A->m_array).m_base.size) {
      __assert_fail("aw == bh",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x12a5,
                    "void xatlas::internal::sparse::sgemm(float, const Matrix &, const Matrix &, float, Matrix &)"
                   );
    }
    if (A->m_width == local_90.m_array.m_base.size) {
      if (local_68.m_width != local_90.m_array.m_base.size) {
        __assert_fail("w == bw",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x12a7,
                      "void xatlas::internal::sparse::sgemm(float, const Matrix &, const Matrix &, float, Matrix &)"
                     );
      }
      if (local_68.m_array.m_base.size == local_68.m_width) {
        for (uVar7 = 0; uVar7 != local_68.m_width; uVar7 = uVar7 + 1) {
          for (uVar9 = 0; uVar9 != local_68.m_width; uVar9 = uVar9 + 1) {
            fVar10 = sparse::Matrix::getCoefficient(&local_68,uVar9,uVar7);
            pAVar5 = Array<xatlas::internal::Array<xatlas::internal::sparse::Matrix::Coefficient>_>
                     ::operator[](&local_90.m_array,uVar7);
            uVar3 = (pAVar5->m_base).size;
            fVar12 = 0.0;
            for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
              pCVar6 = Array<xatlas::internal::sparse::Matrix::Coefficient>::operator[]
                                 (pAVar5,uVar8);
              fVar1 = pCVar6->v;
              fVar11 = sparse::Matrix::getCoefficient(A,uVar9,pCVar6->x);
              fVar12 = fVar12 + fVar1 * fVar11;
            }
            sparse::Matrix::setCoefficient(&local_68,uVar9,uVar7,fVar10 * 0.0 + fVar12);
          }
        }
        bVar4 = SymmetricSolver(&local_68,(FullVector *)&local_48,local_70,epsilon);
        sparse::Matrix::~Matrix(&local_68);
        ArrayBase::~ArrayBase(&local_48);
        sparse::Matrix::~Matrix(&local_90);
        return bVar4;
      }
      __assert_fail("h == ah",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                    ,0x12a8,
                    "void xatlas::internal::sparse::sgemm(float, const Matrix &, const Matrix &, float, Matrix &)"
                   );
    }
    __assert_fail("bw == ah",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x12a6,
                  "void xatlas::internal::sparse::sgemm(float, const Matrix &, const Matrix &, float, Matrix &)"
                 );
  }
  __assert_fail("A.width() == B.height()",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x128a,"void xatlas::internal::sparse::transpose(const Matrix &, Matrix &)");
}

Assistant:

static bool LeastSquaresSolver(const sparse::Matrix &A, const FullVector &b, FullVector &x, float epsilon = 1e-5f)
	{
		XA_DEBUG_ASSERT(A.width() == x.dimension());
		XA_DEBUG_ASSERT(A.height() == b.dimension());
		XA_DEBUG_ASSERT(A.height() >= A.width()); // @@ If height == width we could solve it directly...
		const uint32_t D = A.width();
		sparse::Matrix At(A.height(), A.width());
		sparse::transpose(A, At);
		FullVector Atb(D);
		sparse::mult(At, b, Atb);
		sparse::Matrix AtA(D);
		sparse::mult(At, A, AtA);
		return SymmetricSolver(AtA, Atb, x, epsilon);
	}